

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a2.cpp
# Opt level: O0

void __thiscall
RasterizerA2::_renderImpl<CompositorScalar,false>(RasterizerA2 *this,uint32_t argb32)

{
  int iVar1;
  Cell *pCVar2;
  Cell *pCVar3;
  bool bVar4;
  uint32_t uVar5;
  intptr_t iVar6;
  uchar *puVar7;
  int *piVar8;
  ulong uVar9;
  int32_t *piVar10;
  int local_d8;
  int local_d4;
  int cover;
  int local_cc;
  int x1;
  int x0;
  Cell *cell;
  uint32_t *dstPix;
  Cell *pCStack_b0;
  CompositorScalar compositor;
  uint8_t *dstLine;
  intptr_t stride;
  size_t y1;
  size_t y0;
  uint32_t argb32_local;
  RasterizerA2 *this_local;
  uint32_t mask;
  ulong local_50;
  uint32_t local_c;
  
  y1 = (size_t)(this->_yBounds).start;
  iVar1 = (this->_yBounds).end;
  iVar6 = Image::stride((this->super_CellRasterizer).super_Rasterizer._dst);
  puVar7 = Image::data<unsigned_char>((this->super_CellRasterizer).super_Rasterizer._dst);
  pCStack_b0 = (Cell *)(puVar7 + y1 * iVar6);
  dstPix._4_4_ = PixelUtils::premultiply(argb32);
  for (; y1 <= (ulong)(long)iVar1; y1 = y1 + 1) {
    cell = pCStack_b0;
    _x1 = this->_cells + y1 * this->_cellStride;
    bVar4 = Bounds::empty(this->_xBounds + y1);
    if (!bVar4) {
      local_cc = this->_xBounds[y1].start;
      local_d4 = this->_xBounds[y1].end + 1;
      piVar8 = std::min<int>(&local_d4,&(this->super_CellRasterizer).super_Rasterizer._width);
      cover = *piVar8;
      Bounds::reset(this->_xBounds + y1);
      pCVar3 = cell;
      pCVar2 = _x1;
      local_d8 = 0;
      uVar9 = (ulong)cover;
      for (local_50 = (ulong)local_cc; local_50 < uVar9; local_50 = local_50 + 1) {
        local_d8 = pCVar2[local_50].cover + local_d8;
        local_c = local_d8 - (pCVar2[local_50].area >> 9) & 0x1ff;
        if (0xff < local_c) {
          local_c = 0x1ff - local_c;
        }
        Cell::reset(pCVar2 + local_50);
        if (local_c == 0xff) {
          (&pCVar3->cover)[local_50] = dstPix._4_4_;
        }
        else {
          piVar10 = &pCVar3->cover + local_50;
          uVar5 = PixelUtils::src(*piVar10,dstPix._4_4_,local_c);
          *piVar10 = uVar5;
        }
      }
    }
    pCStack_b0 = (Cell *)((long)&pCStack_b0->cover + iVar6);
  }
  Bounds::reset(&this->_yBounds);
  return;
}

Assistant:

inline void RasterizerA2::_renderImpl(uint32_t argb32) noexcept {
  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  intptr_t stride = _dst->stride();
  uint8_t* dstLine = _dst->data() + y0 * stride;

  Compositor compositor(argb32);
  while (y0 <= y1) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y0 * _cellStride];

    if (!_xBounds[y0].empty()) {
      int x0 = _xBounds[y0].start;
      int x1 = std::min(_xBounds[y0].end + 1, _width);
      _xBounds[y0].reset();

      int cover = 0;
      compositor.template vmask<NonZero>(dstPix, size_t(x0), size_t(x1), cell, cover);
    }

    y0++;
    dstLine += stride;
  }

  _yBounds.reset();
}